

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,GlobalInstanceVar *var)

{
  bool bVar1;
  string *psVar2;
  ExternalInstanceRef local_28;
  GlobalInstanceVar *local_18;
  GlobalInstanceVar *var_local;
  CWriter *this_local;
  
  local_18 = var;
  var_local = (GlobalInstanceVar *)this;
  bVar1 = Var::is_name(var->var);
  if (!bVar1) {
    __assert_fail("var.var.is_name()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/c-writer.cc"
                  ,0x40e,
                  "void wabt::(anonymous namespace)::CWriter::Write(const GlobalInstanceVar &)");
  }
  psVar2 = Var::name_abi_cxx11_(local_18->var);
  ExternalInstanceRef::GlobalName(&local_28,Global,psVar2);
  Write(this,&local_28);
  return;
}

Assistant:

void CWriter::Write(const GlobalInstanceVar& var) {
  assert(var.var.is_name());
  Write(ExternalInstanceRef(ModuleFieldType::Global, var.var.name()));
}